

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O0

void xml_print_attrs(lyout *out,lyd_node *node,int options)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  lys_module *plVar4;
  char *pcVar5;
  char *local_88;
  size_t len;
  char *p;
  lys_module *wdmod;
  uint local_50;
  int rpc_filter;
  uint32_t i;
  uint32_t ns_count;
  char *mod_name;
  char *xml_expr;
  char **nss;
  char **prefs;
  lyd_attr *attr;
  lyd_node *plStack_18;
  int options_local;
  lyd_node *node_local;
  lyout *out_local;
  
  mod_name = (char *)0x0;
  bVar2 = false;
  attr._4_4_ = options;
  plStack_18 = node;
  node_local = (lyd_node *)out;
  if (((node->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
     (((((node->field_0x9 & 1) != 0 && ((options & 0xc0U) != 0)) ||
       (((node->field_0x9 & 1) == 0 &&
        (((options & 0x40U) != 0 && (iVar3 = lyd_wd_default((lyd_node_leaf_list *)node), iVar3 != 0)
         ))))) &&
      (plVar4 = ly_ctx_get_module(plStack_18->schema->module->ctx,"ietf-netconf-with-defaults",
                                  (char *)0x0), plVar4 != (lys_module *)0x0)))) {
    ly_print((lyout *)node_local," %s:default=\"true\"",plVar4->prefix);
  }
  iVar3 = strcmp(plStack_18->schema->name,"filter");
  if ((iVar3 == 0) &&
     ((iVar3 = strcmp(plStack_18->schema->module->name,"ietf-netconf"), iVar3 == 0 ||
      (iVar3 = strcmp(plStack_18->schema->module->name,"notifications"), iVar3 == 0)))) {
    bVar2 = true;
  }
  prefs = (char **)plStack_18->attr;
  do {
    if (prefs == (char **)0x0) {
      return;
    }
    if (bVar2) {
      iVar3 = strcmp(prefs[3],"select");
      if (iVar3 == 0) {
        mod_name = transform_json2xml(plStack_18->schema->module,prefs[4],&nss,(char ***)&xml_expr,
                                      (uint32_t *)&rpc_filter);
        if (mod_name == (char *)0x0) {
          ly_print((lyout *)node_local,"\"(!error!)\"");
          return;
        }
        for (local_50 = 0; local_50 < (uint)rpc_filter; local_50 = local_50 + 1) {
          ly_print((lyout *)node_local," xmlns:%s=\"%s\"",nss[local_50],
                   *(undefined8 *)(xml_expr + (ulong)local_50 * 8));
        }
        free(nss);
        free(xml_expr);
      }
      ly_print((lyout *)node_local," %s=\"",prefs[3]);
    }
    else {
      ly_print((lyout *)node_local," %s:%s=\"",*(undefined8 *)(*(long *)(prefs[2] + 0x30) + 0x10),
               prefs[3]);
    }
    switch(*(ushort *)(prefs + 6) & 0x3f) {
    case 1:
    case 2:
    case 3:
    case 4:
    case 6:
    case 10:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
      if (prefs[4] != (char *)0x0) {
        if (mod_name == (char *)0x0) {
          local_88 = prefs[4];
        }
        else {
          local_88 = mod_name;
        }
        lyxml_dump_text((lyout *)node_local,local_88);
      }
      break;
    case 5:
      break;
    case 7:
      if (prefs[4] != (char *)0x0) {
        pcVar5 = strchr(prefs[4],0x3a);
        if (pcVar5 == (char *)0x0) {
          __assert_fail("p",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_xml.c"
                        ,0xd4,"void xml_print_attrs(struct lyout *, const struct lyd_node *, int)");
        }
        pcVar1 = prefs[4];
        _i = *(char **)(*(long *)(prefs[2] + 0x30) + 8);
        iVar3 = strncmp(prefs[4],_i,(long)pcVar5 - (long)pcVar1);
        if ((iVar3 != 0) || (_i[(long)pcVar5 - (long)pcVar1] != '\0')) goto LAB_001baa4d;
        lyxml_dump_text((lyout *)node_local,pcVar5 + 1);
      }
      break;
    case 8:
LAB_001baa4d:
      mod_name = transform_json2xml(plStack_18->schema->module,(char *)plStack_18->child,&nss,
                                    (char ***)&xml_expr,(uint32_t *)&rpc_filter);
      if (mod_name == (char *)0x0) {
        ly_print((lyout *)node_local,"(!error!)");
        return;
      }
      for (local_50 = 0; local_50 < (uint)rpc_filter; local_50 = local_50 + 1) {
        ly_print((lyout *)node_local," xmlns:%s=\"%s\"",nss[local_50],
                 *(undefined8 *)(xml_expr + (ulong)local_50 * 8));
      }
      free(nss);
      free(xml_expr);
      lyxml_dump_text((lyout *)node_local,mod_name);
      lydict_remove(plStack_18->schema->module->ctx,mod_name);
      break;
    default:
      ly_print((lyout *)node_local,"(!error!)");
    }
    ly_print((lyout *)node_local,"\"");
    if (mod_name != (char *)0x0) {
      lydict_remove(plStack_18->schema->module->ctx,mod_name);
    }
    prefs = (char **)prefs[1];
  } while( true );
}

Assistant:

static void
xml_print_attrs(struct lyout *out, const struct lyd_node *node, int options)
{
    struct lyd_attr *attr;
    const char **prefs, **nss;
    const char *xml_expr = NULL, *mod_name;
    uint32_t ns_count, i;
    int rpc_filter = 0;
    const struct lys_module *wdmod = NULL;
    char *p;
    size_t len;

    /* with-defaults */
    if (node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        if ((node->dflt && (options & (LYP_WD_ALL_TAG | LYP_WD_IMPL_TAG))) ||
                (!node->dflt && (options & LYP_WD_ALL_TAG) && lyd_wd_default((struct lyd_node_leaf_list *)node))) {
            /* we have implicit OR explicit default node */
            /* get with-defaults module */
            wdmod = ly_ctx_get_module(node->schema->module->ctx, "ietf-netconf-with-defaults", NULL);
            if (wdmod) {
                /* print attribute only if context include with-defaults schema */
                ly_print(out, " %s:default=\"true\"", wdmod->prefix);
            }
        }
    }
    /* technically, check for the extension get-filter-element-attributes from ietf-netconf */
    if (!strcmp(node->schema->name, "filter")
            && (!strcmp(node->schema->module->name, "ietf-netconf") || !strcmp(node->schema->module->name, "notifications"))) {
        rpc_filter = 1;
    }

    for (attr = node->attr; attr; attr = attr->next) {
        if (rpc_filter) {
            /* exception for NETCONF's filter's attributes */
            if (!strcmp(attr->name, "select")) {
                /* xpath content, we have to convert the JSON format into XML first */
                xml_expr = transform_json2xml(node->schema->module, attr->value_str, &prefs, &nss, &ns_count);
                if (!xml_expr) {
                    /* error */
                    ly_print(out, "\"(!error!)\"");
                    return;
                }

                for (i = 0; i < ns_count; ++i) {
                    ly_print(out, " xmlns:%s=\"%s\"", prefs[i], nss[i]);
                }
                free(prefs);
                free(nss);
            }
            ly_print(out, " %s=\"", attr->name);
        } else {
            ly_print(out, " %s:%s=\"", attr->annotation->module->prefix, attr->name);
        }

        switch (attr->value_type & LY_DATA_TYPE_MASK) {
        case LY_TYPE_BINARY:
        case LY_TYPE_STRING:
        case LY_TYPE_BITS:
        case LY_TYPE_ENUM:
        case LY_TYPE_BOOL:
        case LY_TYPE_DEC64:
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            if (attr->value_str) {
                /* xml_expr can contain transformed xpath */
                lyxml_dump_text(out, xml_expr ? xml_expr : attr->value_str);
            }
            break;

        case LY_TYPE_IDENT:
            if (!attr->value_str) {
                break;
            }
            p = strchr(attr->value_str, ':');
            assert(p);
            len = p - attr->value_str;
            mod_name = attr->annotation->module->name;
            if (!strncmp(attr->value_str, mod_name, len) && !mod_name[len]) {
                lyxml_dump_text(out, ++p);
            } else {
                /* avoid code duplication - use instance-identifier printer which gets necessary namespaces to print */
                goto printinst;
            }
            break;
        case LY_TYPE_INST:
printinst:
            xml_expr = transform_json2xml(node->schema->module, ((struct lyd_node_leaf_list *)node)->value_str,
                                          &prefs, &nss, &ns_count);
            if (!xml_expr) {
                /* error */
                ly_print(out, "(!error!)");
                return;
            }

            for (i = 0; i < ns_count; ++i) {
                ly_print(out, " xmlns:%s=\"%s\"", prefs[i], nss[i]);
            }
            free(prefs);
            free(nss);

            lyxml_dump_text(out, xml_expr);
            lydict_remove(node->schema->module->ctx, xml_expr);
            break;

        /* LY_TYPE_LEAFREF not allowed */
        case LY_TYPE_EMPTY:
            break;

        default:
            /* error */
            ly_print(out, "(!error!)");
        }

        ly_print(out, "\"");

        if (xml_expr) {
            lydict_remove(node->schema->module->ctx, xml_expr);
        }
    }
}